

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DistExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::DistExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::DistExpression::DistItem,18446744073709551615ul>,std::optional<slang::ast::DistExpression::DistWeight>&,slang::SourceRange>
          (BumpAllocator *this,Type *args,Expression *args_1,
          span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *args_2,
          optional<slang::ast::DistExpression::DistWeight> *args_3,SourceRange *args_4)

{
  pointer pDVar1;
  size_t sVar2;
  undefined8 uVar3;
  Expression *pEVar4;
  SourceLocation SVar5;
  SourceLocation SVar6;
  bool bVar7;
  undefined7 uVar8;
  DistExpression *pDVar9;
  
  pDVar9 = (DistExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DistExpression *)this->endPtr < pDVar9 + 1) {
    pDVar9 = (DistExpression *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pDVar9 + 1);
  }
  pDVar1 = args_2->_M_ptr;
  sVar2 = (args_2->_M_extent)._M_extent_value;
  bVar7 = (args_3->super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>).
          _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged
  ;
  uVar8 = *(undefined7 *)
           &(args_3->super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>).
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            field_0x11;
  uVar3 = *(undefined8 *)
           &(args_3->super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>).
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload;
  pEVar4 = (args_3->super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>).
           _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
           _M_payload._M_value.expr;
  SVar5 = args_4->startLoc;
  SVar6 = args_4->endLoc;
  (pDVar9->super_Expression).kind = Dist;
  (pDVar9->super_Expression).type.ptr = args;
  (pDVar9->super_Expression).constant = (ConstantValue *)0x0;
  (pDVar9->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pDVar9->super_Expression).sourceRange.startLoc = SVar5;
  (pDVar9->super_Expression).sourceRange.endLoc = SVar6;
  pDVar9->left_ = args_1;
  (pDVar9->items_)._M_ptr = pDVar1;
  (pDVar9->items_)._M_extent._M_extent_value = sVar2;
  (pDVar9->defaultWeight_).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged = bVar7
  ;
  *(undefined7 *)
   &(pDVar9->defaultWeight_).
    super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 = uVar8;
  *(undefined8 *)
   &(pDVar9->defaultWeight_).
    super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload = uVar3;
  (pDVar9->defaultWeight_).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
  _M_value.expr = pEVar4;
  return pDVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }